

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_complicatedMultiplicationFactorUnits_Test::TestBody
          (Units_complicatedMultiplicationFactorUnits_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr bunch_of_bananas;
  ModelPtr model;
  UnitsPtr incredible_pile_of_square_apples;
  UnitsPtr u2;
  UnitsPtr u1;
  UnitsPtr square_apple;
  UnitsPtr u4;
  UnitsPtr u3;
  UnitsPtr bushell_of_apples;
  UnitsPtr banana;
  UnitsPtr apple;
  UnitsPtr u;
  long *local_138;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  double local_f8;
  string *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long local_e0 [2];
  string *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  string *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Model::create();
  libcellml::Units::create();
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u","");
  libcellml::NamedEntity::setName(local_30);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u1","");
  libcellml::Units::create((string *)&local_a0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  psVar1 = local_a0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"milli","");
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_138,2.0,1000.0,(string *)local_118);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"dimensionless","");
  libcellml::Units::addUnit(local_a0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u2","");
  libcellml::Units::create((string *)&local_b0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  psVar1 = local_b0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"kilo","");
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_138,2.0,0.001,(string *)local_118);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"dimensionless","");
  libcellml::Units::addUnit(local_b0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u3","");
  libcellml::Units::create((string *)&local_70);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"kilo","");
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  libcellml::Units::addUnit(local_70,(string *)&local_138,4.0,0.001,(string *)local_118);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u4","");
  libcellml::Units::create((string *)&local_80);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u2","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  libcellml::Units::addUnit(local_80,2.0,(string *)&local_138);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"apple","");
  libcellml::Units::create(local_40);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"banana","");
  libcellml::Units::create(local_50);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"bushell_of_apples","");
  libcellml::Units::create((string *)&local_60);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"apple","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"mega","");
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  libcellml::Units::addUnit(local_60,(string *)&local_138,1.0,1000.0,(string *)local_118);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"square_apple","");
  libcellml::Units::create((string *)&local_90);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"apple","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"");
  libcellml::Units::addUnit(local_90,2.0,(string *)&local_138);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"incredible_pile_of_square_apples","");
  libcellml::Units::create((string *)&local_c0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"square_apple","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"mega","");
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  libcellml::Units::addUnit(local_c0,(string *)&local_138,1.0,100.0,(string *)local_118);
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"bunch_of_bananas","");
  libcellml::Units::create((string *)&local_f0);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  psVar1 = local_f0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"banana","");
  pcVar3 = "";
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"","");
  libcellml::Units::addUnit(psVar1,(int)&local_138,1.0,1.0,(string *)0x1);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  psVar1 = local_d0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  local_118[0] = (long *)&DAT_3ff0000000000000;
  local_f8 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_a0,(shared_ptr *)&local_b0,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_138,"1.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)local_118,&local_f8);
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x521,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_118[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_118[0] != (long *)0x0)) {
        (**(code **)(*local_118[0] + 8))();
      }
      local_118[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = (long *)&DAT_3ff0000000000000;
  local_f8 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_70,(shared_ptr *)&local_80,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_138,"1.0","libcellml::Units::scalingFactor(u3, u4)",
             (double *)local_118,&local_f8);
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x522,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_118[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_118[0] != (long *)0x0)) {
        (**(code **)(*local_118[0] + 8))();
      }
      local_118[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = (long *)&DAT_3e45798ee2308c3a;
  local_f8 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_c0,(shared_ptr *)&local_90,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_138,"1e-08",
             "libcellml::Units::scalingFactor(incredible_pile_of_square_apples, square_apple)",
             (double *)local_118,&local_f8);
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x523,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_118[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_118[0] != (long *)0x0)) {
        (**(code **)(*local_118[0] + 8))();
      }
      local_118[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_118[0] = (long *)0x0;
  local_f8 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_c0,(shared_ptr *)&local_f0,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_138,"0.0",
             "libcellml::Units::scalingFactor(incredible_pile_of_square_apples, bunch_of_bananas)",
             (double *)local_118,&local_f8);
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_118);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x525,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_118[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_118[0] != (long *)0x0)) {
        (**(code **)(*local_118[0] + 8))();
      }
      local_118[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  return;
}

Assistant:

TEST(Units, complicatedMultiplicationFactorUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0); // u1 = u^2
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001); // u2 = u^2
    u2->addUnit("dimensionless");

    libcellml::UnitsPtr u3 = libcellml::Units::create("u3");
    u3->addUnit("u", "kilo", 4.0, 0.001); // u3 = u^4

    libcellml::UnitsPtr u4 = libcellml::Units::create("u4");
    u4->addUnit("u2", 2.0); // u4 = u^4

    libcellml::UnitsPtr apple = libcellml::Units::create("apple");
    libcellml::UnitsPtr banana = libcellml::Units::create("banana");

    libcellml::UnitsPtr bushell_of_apples = libcellml::Units::create("bushell_of_apples");
    bushell_of_apples->addUnit("apple", "mega", 1.0, 1000.0); // 1000*mega*apple^1

    libcellml::UnitsPtr square_apple = libcellml::Units::create("square_apple");
    square_apple->addUnit("apple", 2.0);

    libcellml::UnitsPtr incredible_pile_of_square_apples = libcellml::Units::create("incredible_pile_of_square_apples");
    incredible_pile_of_square_apples->addUnit("square_apple", "mega", 1.0, 100.0);

    libcellml::UnitsPtr bunch_of_bananas = libcellml::Units::create("bunch_of_bananas");
    bunch_of_bananas->addUnit("banana", 1, 1.0, 1.0); // 10 bananas

    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(u4);
    model->addUnits(bushell_of_apples);
    model->addUnits(apple);
    model->addUnits(banana);
    model->addUnits(square_apple);
    model->addUnits(incredible_pile_of_square_apples);
    model->addUnits(bunch_of_bananas);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u3, u4));
    EXPECT_EQ(1e-08, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, square_apple));
    // Incompatible units so we return a scaling factor of 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, bunch_of_bananas));
}